

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_player_prop_bindui(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  char *in_RAX;
  char *pcVar3;
  char *__s1;
  void *pvVar4;
  undefined8 *p_00;
  long lVar5;
  parser_error pVar6;
  char *end;
  char *local_38;
  
  local_38 = in_RAX;
  pcVar3 = parser_getsym(p,"ui");
  __s1 = parser_getsym(p,"uival");
  wVar1 = parser_getint(p,"aux");
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    p_00 = (undefined8 *)mem_alloc(0x18);
    pcVar3 = string_make(pcVar3);
    *p_00 = pcVar3;
    iVar2 = strcmp(__s1,"special");
    if (iVar2 == 0) {
      *(undefined4 *)(p_00 + 2) = 0;
      *(undefined1 *)((long)p_00 + 0x15) = 1;
    }
    else {
      lVar5 = strtol(__s1,&local_38,10);
      pVar6 = PARSE_ERROR_NOT_NUMBER;
      if (((*__s1 == '\0') || (*local_38 != '\0')) ||
         (pVar6 = PARSE_ERROR_INVALID_VALUE, lVar5 - 0x7fffffffU < 0xffffffff00000002)) {
        string_free((char *)*p_00);
        mem_free(p_00);
        return pVar6;
      }
      *(int *)(p_00 + 2) = (int)lVar5;
      *(undefined1 *)((long)p_00 + 0x15) = 0;
    }
    *(bool *)((long)p_00 + 0x14) = wVar1 != L'\0';
    p_00[1] = *(undefined8 *)((long)pvVar4 + 0x30);
    *(undefined8 **)((long)pvVar4 + 0x30) = p_00;
    pVar6 = PARSE_ERROR_NONE;
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_player_prop_bindui(struct parser *p) {
	const char *name = parser_getsym(p, "ui");
	const char *value = parser_getsym(p, "uival");
	bool isaux = (parser_getint(p, "aux") != 0);
	struct embryo_player_ability *embryo = parser_priv(p);
	struct player_bound_ui *boundui;
	if (!embryo)
		return PARSE_ERROR_MISSING_RECORD_HEADER;

	boundui = mem_alloc(sizeof(*boundui));
	boundui->name = string_make(name);
	if (streq(value, "special")) {
		boundui->value = 0;
		boundui->isspecial = true;
	} else {
		long v;
		char* end;

		v = strtol(value, &end, 10);
		if (! *value || *end) {
			string_free(boundui->name);
			mem_free(boundui);
			return PARSE_ERROR_NOT_NUMBER;
		}
		/*
		 * Also reject INT_MIN and INT_MAX so we don't have to check
		 * errno to detect out of range values on platforms where
		 * sizeof(int) == sizeof(long).
		 */
		if (v <= INT_MIN || v >= INT_MAX) {
			string_free(boundui->name);
			mem_free(boundui);
			return PARSE_ERROR_INVALID_VALUE;
		}
		boundui->value = (int) v;
		boundui->isspecial = false;
	}
	boundui->isaux = isaux;
	boundui->next = embryo->boundui;
	embryo->boundui = boundui;
	return PARSE_ERROR_NONE;
}